

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

void __thiscall brotli::ZopfliCostModel::~ZopfliCostModel(ZopfliCostModel *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->literal_costs_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->cost_dist_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

ZopfliCostModel() : min_cost_cmd_(kInfinity) {}